

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall Timer::clockHandler(Timer *this)

{
  bool bVar1;
  int iVar2;
  undefined1 local_d8 [8];
  AutoLock l;
  undefined1 local_b0 [8];
  Mutex m;
  Condition c;
  timespec cur;
  timespec start;
  Timer *this_local;
  
  Condition::Condition((Condition *)&m.mLockLine);
  Mutex::Mutex((Mutex *)local_b0,false);
  AutoLock::AutoLock((AutoLock *)local_d8,(Mutex *)local_b0);
  TimeUtils::getCurTime((timespec *)&cur.tv_nsec);
  while (bVar1 = JHThread::Runnable<Timer>::CheckStop(this->mClockThread),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    bVar1 = Condition::Wait((Condition *)&m.mLockLine,(Mutex *)local_b0,this->mMsPerTick);
    if (bVar1) {
      jh_log_print(1,"void Timer::clockHandler()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Timer.cpp"
                   ,0xb2,"Signal recieved on timer condition????\n");
    }
    else {
      TimeUtils::getCurTime((timespec *)((long)&c.mCond + 0x28));
      iVar2 = TimeUtils::getDifference((timespec *)((long)&c.mCond + 0x28),(timespec *)&cur.tv_nsec)
      ;
      if ((iVar2 < 0) ||
         (iVar2 = TimeUtils::getDifference
                            ((timespec *)((long)&c.mCond + 0x28),(timespec *)&cur.tv_nsec),
         10000 < iVar2)) {
        TimeUtils::getCurTime((timespec *)&cur.tv_nsec);
        handleTick(this);
      }
      else {
        while (iVar2 = TimeUtils::getDifference
                                 ((timespec *)((long)&c.mCond + 0x28),(timespec *)&cur.tv_nsec),
              this->mMsPerTick < iVar2) {
          TimeUtils::addOffset((timespec *)&cur.tv_nsec,this->mMsPerTick);
          handleTick(this);
        }
      }
    }
  }
  AutoLock::~AutoLock((AutoLock *)local_d8);
  Mutex::~Mutex((Mutex *)local_b0);
  Condition::~Condition((Condition *)&m.mLockLine);
  return;
}

Assistant:

void Timer::clockHandler()
{
	TRACE_BEGIN( LOG_LVL_INFO );	
	struct timespec start, cur;
	Condition c;
	Mutex m;
	AutoLock l(m);
	
	TimeUtils::getCurTime( &start );
	while ( !mClockThread->CheckStop() )
	{	
		// Wait for the tick to timeout
		if (not c.Wait(m, mMsPerTick))
		{
			TimeUtils::getCurTime( &cur );
			
			// Check to see if the clock was set back, or jumps
			// forward by more than 10 seconds. If so, update the
			// starting time to the current time and wait for the next
			// tick.
			if ( TimeUtils::getDifference( &cur, &start ) < 0 or
				 TimeUtils::getDifference( &cur, &start ) > 10000 )
			{
				TimeUtils::getCurTime( &start );
				handleTick();
			}
			else
			{	
				// Get the current time and count ticks until cur time and the 
				// actual tick time are less the mMsPerTick apart.
				while ( TimeUtils::getDifference( &cur, &start ) > mMsPerTick )
				{
					TimeUtils::addOffset( &start, mMsPerTick );
					handleTick();
				}
			}
		}
		else
		{
			LOG_ERR_FATAL("Signal recieved on timer condition????\n");
		}
	}
}